

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

void av1_primary_rc_init(AV1EncoderConfig *oxcf,PRIMARY_RATE_CONTROL *p_rc)

{
  int i;
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  
  iVar5 = (oxcf->rc_cfg).worst_allowed_q;
  uVar1 = (oxcf->gf_cfg).min_gf_interval;
  uVar4 = (oxcf->gf_cfg).max_gf_interval;
  if (uVar1 == 0) {
    uVar1 = av1_rc_get_default_min_gf_interval
                      ((oxcf->frm_dim_cfg).width,(oxcf->frm_dim_cfg).height,
                       (oxcf->input_cfg).init_framerate);
  }
  if (uVar4 == 0) {
    uVar4 = (uint)((oxcf->input_cfg).init_framerate * 0.75);
    if (0x1f < (int)uVar4) {
      uVar4 = 0x20;
    }
    uVar4 = (uVar4 & 1) + uVar4;
    if ((int)uVar4 <= (int)uVar1) {
      uVar4 = uVar1;
    }
    if ((int)uVar4 < 0x21) {
      uVar4 = 0x20;
    }
  }
  p_rc->baseline_gf_interval = (int)(uVar4 + uVar1) / 2;
  p_rc->this_key_frame_forced = 0;
  p_rc->next_key_frame_forced = 0;
  p_rc->ni_frames = 0;
  p_rc->tot_q = 0.0;
  p_rc->total_actual_bits = 0;
  p_rc->total_target_bits = 0;
  p_rc->buffer_level = p_rc->starting_buffer_level;
  if (oxcf->target_seq_level_idx[0] < 0x1c) {
    iVar5 = 0xff;
  }
  if ((oxcf->pass == AOM_RC_ONE_PASS) && ((oxcf->rc_cfg).mode == AOM_CBR)) {
    p_rc->avg_frame_qindex[0] = iVar5;
  }
  else {
    p_rc->avg_frame_qindex[0] = ((oxcf->rc_cfg).best_allowed_q + iVar5) / 2;
    iVar5 = (iVar5 + (oxcf->rc_cfg).best_allowed_q) / 2;
  }
  p_rc->avg_frame_qindex[1] = iVar5;
  dVar6 = av1_convert_qindex_to_q((oxcf->rc_cfg).worst_allowed_q,(oxcf->tool_cfg).bit_depth);
  p_rc->avg_q = dVar6;
  p_rc->last_q[0] = (oxcf->rc_cfg).best_allowed_q;
  p_rc->last_q[1] = (oxcf->rc_cfg).worst_allowed_q;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    p_rc->rate_correction_factors[lVar3] = 0.7;
  }
  p_rc->rate_correction_factors[3] = 1.0;
  p_rc->bits_off_target = p_rc->starting_buffer_level;
  iVar2 = (int)((double)(oxcf->rc_cfg).target_bandwidth / (oxcf->input_cfg).init_framerate);
  iVar5 = 1;
  if (1 < iVar2) {
    iVar5 = iVar2;
  }
  p_rc->rolling_target_bits = iVar5;
  p_rc->rolling_actual_bits = iVar5;
  return;
}

Assistant:

void av1_primary_rc_init(const AV1EncoderConfig *oxcf,
                         PRIMARY_RATE_CONTROL *p_rc) {
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;

  int worst_allowed_q = rc_cfg->worst_allowed_q;

  int min_gf_interval = oxcf->gf_cfg.min_gf_interval;
  int max_gf_interval = oxcf->gf_cfg.max_gf_interval;
  if (min_gf_interval == 0)
    min_gf_interval = av1_rc_get_default_min_gf_interval(
        oxcf->frm_dim_cfg.width, oxcf->frm_dim_cfg.height,
        oxcf->input_cfg.init_framerate);
  if (max_gf_interval == 0)
    max_gf_interval = get_default_max_gf_interval(
        oxcf->input_cfg.init_framerate, min_gf_interval);
  p_rc->baseline_gf_interval = (min_gf_interval + max_gf_interval) / 2;
  p_rc->this_key_frame_forced = 0;
  p_rc->next_key_frame_forced = 0;
  p_rc->ni_frames = 0;

  p_rc->tot_q = 0.0;
  p_rc->total_actual_bits = 0;
  p_rc->total_target_bits = 0;
  p_rc->buffer_level = p_rc->starting_buffer_level;

  if (oxcf->target_seq_level_idx[0] < SEQ_LEVELS) {
    worst_allowed_q = 255;
  }
  if (oxcf->pass == AOM_RC_ONE_PASS && rc_cfg->mode == AOM_CBR) {
    p_rc->avg_frame_qindex[KEY_FRAME] = worst_allowed_q;
    p_rc->avg_frame_qindex[INTER_FRAME] = worst_allowed_q;
  } else {
    p_rc->avg_frame_qindex[KEY_FRAME] =
        (worst_allowed_q + rc_cfg->best_allowed_q) / 2;
    p_rc->avg_frame_qindex[INTER_FRAME] =
        (worst_allowed_q + rc_cfg->best_allowed_q) / 2;
  }
  p_rc->avg_q = av1_convert_qindex_to_q(rc_cfg->worst_allowed_q,
                                        oxcf->tool_cfg.bit_depth);
  p_rc->last_q[KEY_FRAME] = rc_cfg->best_allowed_q;
  p_rc->last_q[INTER_FRAME] = rc_cfg->worst_allowed_q;

  for (int i = 0; i < RATE_FACTOR_LEVELS; ++i) {
    p_rc->rate_correction_factors[i] = 0.7;
  }
  p_rc->rate_correction_factors[KF_STD] = 1.0;
  p_rc->bits_off_target = p_rc->starting_buffer_level;

  p_rc->rolling_target_bits = AOMMAX(
      1, (int)(oxcf->rc_cfg.target_bandwidth / oxcf->input_cfg.init_framerate));
  p_rc->rolling_actual_bits = AOMMAX(
      1, (int)(oxcf->rc_cfg.target_bandwidth / oxcf->input_cfg.init_framerate));
}